

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::DeleteGuestArena(Recycler *this,ArenaAllocator *arenaAllocator)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  DListNode<Memory::Recycler::GuestArenaAllocator> *pDVar4;
  DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *this_00;
  undefined8 *in_FS_OFFSET;
  
  this_00 = &this->guestArenaList;
  if (this->hasPendingConcurrentFindRoot == true) {
    pDVar4 = (DListNode<Memory::Recycler::GuestArenaAllocator> *)this_00;
    do {
      pDVar4 = (pDVar4->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.node;
      if (pDVar4 == (DListNode<Memory::Recycler::GuestArenaAllocator> *)this_00) break;
    } while (pDVar4 != (DListNode<Memory::Recycler::GuestArenaAllocator> *)
                       &arenaAllocator[-1].
                        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                        freeListSize);
    if (pDVar4 == (DListNode<Memory::Recycler::GuestArenaAllocator> *)this_00) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x21c5,"(guestArenaList.HasElement(guestArenaAllocator))",
                         "guestArenaList.HasElement(guestArenaAllocator)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    this->hasPendingDeleteGuestArena = true;
    *(undefined1 *)
     &arenaAllocator[1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
      super_Allocator.outOfMemoryFunc = 1;
  }
  else {
    DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::
    RemoveElement<Memory::HeapAllocator>
              (this_00,&HeapAllocator::Instance,(GuestArenaAllocator *)arenaAllocator);
  }
  CollectNow<(Memory::CollectionFlags)8320>(this);
  return;
}

Assistant:

void
Recycler::DeleteGuestArena(ArenaAllocator * arenaAllocator)
{
    GuestArenaAllocator * guestArenaAllocator = static_cast<GuestArenaAllocator *>(arenaAllocator);
#if ENABLE_CONCURRENT_GC
    if (this->hasPendingConcurrentFindRoot)
    {
        // We are doing concurrent find root, don't modify the list and mark the arena to be delete
        // later when we do find root in thread.
        Assert(guestArenaList.HasElement(guestArenaAllocator));
        this->hasPendingDeleteGuestArena = true;
        guestArenaAllocator->pendingDelete = true;
    }
    else
#endif
    {
        guestArenaList.RemoveElement(&HeapAllocator::Instance, guestArenaAllocator);
    }

    // Any time a root is removed during a GC, it indicates that an exhaustive
    // collection is likely going to have work to do so trigger an exhaustive
    // candidate GC to indicate this fact
    this->CollectNow<CollectExhaustiveCandidate>();
}